

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::pragma_all_once(CTcTokenizer *this)

{
  tc_toktyp_t tVar1;
  
  tVar1 = next_on_line(&this->p_,&this->curtok_,(tok_embed_ctx *)0x0,0);
  if (tVar1 != TOKT_EOF) {
    if (tVar1 == TOKT_MINUS) {
      *(byte *)this = *(byte *)this & 0xfe;
      goto LAB_00224eb8;
    }
    if (tVar1 != TOKT_PLUS) {
      log_warning(0x271f);
      goto LAB_00224eb8;
    }
  }
  *(byte *)this = *(byte *)this | 1;
LAB_00224eb8:
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pragma_all_once()
{
    tc_toktyp_t tok;

    /* get the next token */
    tok = next_on_line();

    /* 
     *   "+" or empty (end of line or whitespace) indicates ALL_ONCE mode;
     *   '-' indicates standard mode 
     */
    if (tok == TOKT_PLUS || tok == TOKT_EOF)
        all_once_ = TRUE;
    else if (tok == TOKT_MINUS)
        all_once_ = FALSE;
    else
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);

    /* don't retain this pragma in the result */
    clear_linebuf();
}